

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3WhereExplainBloomFilter(Parse *pParse,WhereInfo *pWInfo,WhereLevel *pLevel)

{
  long lVar1;
  sqlite3 *db_00;
  int iVar2;
  long lVar3;
  char *pcVar4;
  long in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  char *z;
  Table *pTab;
  WhereLoop *pLoop;
  int i;
  char *zMsg;
  sqlite3 *db;
  Vdbe *v;
  SrcItem *pItem;
  int ret;
  StrAccum str;
  char zBuf [100];
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  sqlite3_str *in_stack_fffffffffffffef0;
  sqlite3_str *p;
  Vdbe *p_00;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  undefined8 in_stack_ffffffffffffff10;
  long lVar5;
  uint local_dc;
  undefined1 local_98 [24];
  undefined8 local_80;
  char local_78 [8];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)(in_RSI + 8) + 8 + (ulong)*(byte *)(in_RDX + 0x40) * 0x48;
  p_00 = (Vdbe *)in_RDI[2];
  db_00 = (sqlite3 *)*in_RDI;
  local_98._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_98._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  memset(local_78,0xaa,100);
  sqlite3StrAccumInit((StrAccum *)local_98,db_00,local_78,100,1000000000);
  local_80._5_1_ = '\x01';
  sqlite3_str_appendf((StrAccum *)local_98,"BLOOM FILTER ON %S (",lVar3);
  lVar5 = *(long *)(in_RDX + 0x60);
  if ((*(uint *)(lVar5 + 0x30) & 0x100) == 0) {
    for (local_dc = (uint)*(ushort *)(lVar5 + 0x36); iVar2 = (int)in_stack_ffffffffffffff10,
        (int)local_dc < (int)(uint)*(ushort *)(lVar5 + 0x18); local_dc = local_dc + 1) {
      pcVar4 = explainIndexColumnName(*(Index **)(lVar5 + 0x20),local_dc);
      if ((int)(uint)*(ushort *)(lVar5 + 0x36) < (int)local_dc) {
        sqlite3_str_append(in_stack_fffffffffffffef0,
                           (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0);
      }
      sqlite3_str_appendf((StrAccum *)local_98,"%s=?",pcVar4);
    }
  }
  else {
    lVar5 = *(long *)(lVar3 + 0x10);
    if (*(short *)(lVar5 + 0x34) < 0) {
      sqlite3_str_appendf((StrAccum *)local_98,"rowid=?");
      iVar2 = (int)lVar5;
    }
    else {
      sqlite3_str_appendf((StrAccum *)local_98,"%s=?",
                          *(undefined8 *)
                           (*(long *)(lVar5 + 8) + (long)*(short *)(lVar5 + 0x34) * 0x10));
      iVar2 = (int)lVar5;
    }
  }
  p = (sqlite3_str *)local_98;
  sqlite3_str_append(p,(char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),0);
  sqlite3StrAccumFinish((StrAccum *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  sqlite3VdbeCurrentAddr(p_00);
  iVar2 = sqlite3VdbeAddOp4((Vdbe *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                            (int)((ulong)p_00 >> 0x20),(int)p_00,(int)((ulong)p >> 0x20),(int)p,
                            (char *)CONCAT44(in_stack_fffffffffffffeec,0xfffffffa),iVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3WhereExplainBloomFilter(
  const Parse *pParse,               /* Parse context */
  const WhereInfo *pWInfo,           /* WHERE clause */
  const WhereLevel *pLevel           /* Bloom filter on this level */
){
  int ret = 0;
  SrcItem *pItem = &pWInfo->pTabList->a[pLevel->iFrom];
  Vdbe *v = pParse->pVdbe;      /* VM being constructed */
  sqlite3 *db = pParse->db;     /* Database handle */
  char *zMsg;                   /* Text to add to EQP output */
  int i;                        /* Loop counter */
  WhereLoop *pLoop;             /* The where loop */
  StrAccum str;                 /* EQP output string */
  char zBuf[100];               /* Initial space for EQP output string */

  sqlite3StrAccumInit(&str, db, zBuf, sizeof(zBuf), SQLITE_MAX_LENGTH);
  str.printfFlags = SQLITE_PRINTF_INTERNAL;
  sqlite3_str_appendf(&str, "BLOOM FILTER ON %S (", pItem);
  pLoop = pLevel->pWLoop;
  if( pLoop->wsFlags & WHERE_IPK ){
    const Table *pTab = pItem->pSTab;
    if( pTab->iPKey>=0 ){
      sqlite3_str_appendf(&str, "%s=?", pTab->aCol[pTab->iPKey].zCnName);
    }else{
      sqlite3_str_appendf(&str, "rowid=?");
    }
  }else{
    for(i=pLoop->nSkip; i<pLoop->u.btree.nEq; i++){
      const char *z = explainIndexColumnName(pLoop->u.btree.pIndex, i);
      if( i>pLoop->nSkip ) sqlite3_str_append(&str, " AND ", 5);
      sqlite3_str_appendf(&str, "%s=?", z);
    }
  }
  sqlite3_str_append(&str, ")", 1);
  zMsg = sqlite3StrAccumFinish(&str);
  ret = sqlite3VdbeAddOp4(v, OP_Explain, sqlite3VdbeCurrentAddr(v),
                          pParse->addrExplain, 0, zMsg,P4_DYNAMIC);

  sqlite3VdbeScanStatus(v, sqlite3VdbeCurrentAddr(v)-1, 0, 0, 0, 0);
  return ret;
}